

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O3

bool __thiscall
MissingDependencyScanner::PathExistsBetween(MissingDependencyScanner *this,Edge *from,Edge *to)

{
  Edge *to_00;
  bool bVar1;
  _Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
  _Var2;
  iterator iVar3;
  pointer ppNVar4;
  bool bVar5;
  ulong uVar6;
  pair<std::__detail::_Node_iterator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false,_false>,_bool>
  pVar7;
  Edge *local_b8;
  Edge *local_b0;
  _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a8;
  Edge *local_70;
  _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_b8 = to;
  local_b0 = from;
  _Var2._M_cur = (__node_type *)
                 std::
                 _Hashtable<Edge_*,_std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_std::allocator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->adjacency_map_)._M_h,&local_b0);
  if (_Var2._M_cur == (__node_type *)0x0) {
    local_a8._M_buckets = &local_a8._M_single_bucket;
    local_a8._M_bucket_count = 1;
    local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a8._M_element_count = 0;
    local_a8._M_rehash_policy._M_max_load_factor = 1.0;
    local_a8._M_rehash_policy._4_4_ = 0;
    local_a8._M_rehash_policy._M_next_resize = 0;
    local_a8._M_single_bucket = (__node_base_ptr)0x0;
    local_70 = local_b0;
    std::
    _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_68,&local_a8);
    pVar7 = std::
            _Hashtable<Edge*,std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>,std::allocator<std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Edge*,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>
                      ((_Hashtable<Edge*,std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>,std::allocator<std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->adjacency_map_,&local_70);
    _Var2._M_cur = (__node_type *)
                   pVar7.first.
                   super__Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                   ._M_cur;
    std::
    _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    std::
    _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_a8);
  }
  else {
    iVar3 = std::
            _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)_Var2._M_cur + 0x10),&local_b8);
    to = local_b8;
    if (iVar3.super__Node_iterator_base<std::pair<Edge_*const,_bool>,_false>._M_cur !=
        (__node_type *)0x0) {
      return (bool)*(undefined1 *)
                    ((long)iVar3.super__Node_iterator_base<std::pair<Edge_*const,_bool>,_false>.
                           _M_cur + 0x10);
    }
  }
  ppNVar4 = (to->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((to->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar4) {
    uVar6 = 0;
    do {
      to_00 = ppNVar4[uVar6]->in_edge_;
      if ((to_00 != (Edge *)0x0) &&
         ((bVar5 = true, to_00 == local_b0 ||
          (bVar1 = PathExistsBetween(this,local_b0,to_00), to = local_b8, bVar1))))
      goto LAB_0011c958;
      uVar6 = uVar6 + 1;
      ppNVar4 = (to->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(to->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4 >> 3))
    ;
  }
  bVar5 = false;
LAB_0011c958:
  local_70 = to;
  local_68._M_buckets._0_1_ = bVar5;
  std::
  _Hashtable<Edge*,std::pair<Edge*const,bool>,std::allocator<std::pair<Edge*const,bool>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Edge*,bool>>
            ((_Hashtable<Edge*,std::pair<Edge*const,bool>,std::allocator<std::pair<Edge*const,bool>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)((long)&((_Var2._M_cur)->
                        super__Hash_node_value<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>
                        ._M_storage._M_storage + 8));
  return bVar5;
}

Assistant:

bool MissingDependencyScanner::PathExistsBetween(Edge* from, Edge* to) {
  AdjacencyMap::iterator it = adjacency_map_.find(from);
  if (it != adjacency_map_.end()) {
    InnerAdjacencyMap::iterator inner_it = it->second.find(to);
    if (inner_it != it->second.end()) {
      return inner_it->second;
    }
  } else {
    it = adjacency_map_.insert(std::make_pair(from, InnerAdjacencyMap())).first;
  }
  bool found = false;
  for (size_t i = 0; i < to->inputs_.size(); ++i) {
    Edge* e = to->inputs_[i]->in_edge();
    if (e && (e == from || PathExistsBetween(from, e))) {
      found = true;
      break;
    }
  }
  it->second.insert(std::make_pair(to, found));
  return found;
}